

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

int bitset_container_index_equalorlarger(bitset_container_t *container,uint16_t x)

{
  int iVar1;
  ushort in_SI;
  long in_RDI;
  int diff;
  uint64_t word;
  uint32_t k;
  uint32_t x32;
  unsigned_long_long local_28;
  uint local_1c;
  
  local_1c = (uint)(in_SI >> 6);
  local_28 = (*(ulong *)(*(long *)(in_RDI + 8) + (ulong)local_1c * 8) >> ((byte)in_SI & 0x3f)) <<
             ((byte)in_SI & 0x3f);
  while( true ) {
    if (local_28 != 0) {
      iVar1 = roaring_trailing_zeroes(local_28);
      return local_1c * 0x40 + iVar1;
    }
    local_1c = local_1c + 1;
    if (local_1c == 0x400) break;
    local_28 = *(unsigned_long_long *)(*(long *)(in_RDI + 8) + (ulong)local_1c * 8);
  }
  return -1;
}

Assistant:

int bitset_container_index_equalorlarger(const bitset_container_t *container, uint16_t x) {
  uint32_t x32 = x;
  uint32_t k = x32 / 64;
  uint64_t word = container->words[k];
  const int diff = x32 - k * 64; // in [0,64)
  word = (word >> diff) << diff; // a mask is faster, but we don't care
  while(word == 0) {
    k++;
    if(k == BITSET_CONTAINER_SIZE_IN_WORDS) return -1;
    word = container->words[k];
  }
  return k * 64 + roaring_trailing_zeroes(word);
}